

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O2

int CivetServer::requestHandler(mg_connection *conn,void *cbdata)

{
  void *pvVar1;
  char *__s1;
  byte bVar2;
  int iVar3;
  mg_request_info *pmVar4;
  mapped_type *pmVar5;
  uint uVar6;
  long lStack_60;
  uint local_54;
  mg_connection *conn_local;
  _Vector_base<char,_std::allocator<char>_> local_48;
  
  conn_local = conn;
  pmVar4 = mg_get_request_info(conn);
  pvVar1 = pmVar4->user_data;
  local_54 = 0xffffffff;
  if (*(mg_context **)((long)pvVar1 + 8) == (mg_context *)0x0) {
    return 0;
  }
  mg_lock_context(*(mg_context **)((long)pvVar1 + 8));
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pmVar5 = std::
           map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
           ::operator[]((map<const_mg_connection_*,_CivetServer::CivetConnection,_std::less<const_mg_connection_*>,_std::allocator<std::pair<const_mg_connection_*const,_CivetServer::CivetConnection>_>_>
                         *)((long)pvVar1 + 0x10),&conn_local);
  std::vector<char,_std::allocator<char>_>::_M_move_assign(&pmVar5->postData,&local_48);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_48);
  mg_unlock_context(*(mg_context **)((long)pvVar1 + 8));
  uVar6 = 0;
  if (cbdata != (void *)0x0) {
    __s1 = pmVar4->request_method;
    iVar3 = strcmp(__s1,"GET");
    if (iVar3 == 0) {
      (**(code **)(*cbdata + 0x18))(cbdata,pvVar1,conn_local,&local_54);
      if (-1 < (int)local_54) {
        return local_54;
      }
      lStack_60 = 0x10;
    }
    else {
      iVar3 = strcmp(__s1,"POST");
      if (iVar3 == 0) {
        (**(code **)(*cbdata + 0x28))(cbdata,pvVar1,conn_local,&local_54);
        if (-1 < (int)local_54) {
          return local_54;
        }
        lStack_60 = 0x20;
      }
      else {
        iVar3 = strcmp(__s1,"HEAD");
        if (iVar3 == 0) {
          (**(code **)(*cbdata + 0x38))(cbdata,pvVar1,conn_local,&local_54);
          if (-1 < (int)local_54) {
            return local_54;
          }
          lStack_60 = 0x30;
        }
        else {
          iVar3 = strcmp(__s1,"PUT");
          if (iVar3 == 0) {
            (**(code **)(*cbdata + 0x48))(cbdata,pvVar1,conn_local,&local_54);
            if (-1 < (int)local_54) {
              return local_54;
            }
            lStack_60 = 0x40;
          }
          else {
            iVar3 = strcmp(__s1,"DELETE");
            if (iVar3 == 0) {
              (**(code **)(*cbdata + 0x58))(cbdata,pvVar1,conn_local,&local_54);
              if (-1 < (int)local_54) {
                return local_54;
              }
              lStack_60 = 0x50;
            }
            else {
              iVar3 = strcmp(__s1,"OPTIONS");
              if (iVar3 == 0) {
                (**(code **)(*cbdata + 0x68))(cbdata,pvVar1,conn_local,&local_54);
                if (-1 < (int)local_54) {
                  return local_54;
                }
                lStack_60 = 0x60;
              }
              else {
                iVar3 = strcmp(__s1,"PATCH");
                uVar6 = 0;
                if (iVar3 != 0) goto LAB_00109d91;
                (**(code **)(*cbdata + 0x78))(cbdata,pvVar1,conn_local,&local_54);
                if (-1 < (int)local_54) {
                  return local_54;
                }
                lStack_60 = 0x70;
              }
            }
          }
        }
      }
    }
    bVar2 = (**(code **)(*cbdata + lStack_60))(cbdata,pvVar1,conn_local);
    uVar6 = (uint)bVar2;
  }
LAB_00109d91:
  if (-1 < (int)local_54) {
    uVar6 = local_54;
  }
  return uVar6;
}

Assistant:

int
CivetServer::requestHandler(struct mg_connection *conn, void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);
	int http_status_code = -1;
	bool status_ok = false;

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return 0;

	mg_lock_context(me->context);
	me->connections[conn] = CivetConnection();
	mg_unlock_context(me->context);

	CivetHandler *handler = (CivetHandler *)cbdata;

	if (handler) {
		if (strcmp(request_info->request_method, "GET") == 0) {
			status_ok = handler->handleGet(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleGet(me, conn);
			}
		} else if (strcmp(request_info->request_method, "POST") == 0) {
			status_ok = handler->handlePost(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePost(me, conn);
			}
		} else if (strcmp(request_info->request_method, "HEAD") == 0) {
			status_ok = handler->handleHead(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleHead(me, conn);
			}
		} else if (strcmp(request_info->request_method, "PUT") == 0) {
			status_ok = handler->handlePut(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePut(me, conn);
			}
		} else if (strcmp(request_info->request_method, "DELETE") == 0) {
			status_ok = handler->handleDelete(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleDelete(me, conn);
			}
		} else if (strcmp(request_info->request_method, "OPTIONS") == 0) {
			status_ok = handler->handleOptions(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handleOptions(me, conn);
			}
		} else if (strcmp(request_info->request_method, "PATCH") == 0) {
			status_ok = handler->handlePatch(me, conn, &http_status_code);
			if (http_status_code < 0) {
				status_ok = handler->handlePatch(me, conn);
			}
		}
	}

	if (http_status_code < 0) {
		http_status_code = status_ok ? 1 : 0;
	}

	return http_status_code;
}